

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_linear_resampler_process_pcm_frames_f32_downsample
                    (ma_linear_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ma_uint32 mVar7;
  ulong uVar8;
  ma_uint32 mVar9;
  ulong uVar10;
  anon_union_128_2_43a84514_for_x1 *__dest;
  float fVar11;
  float fVar12;
  uint local_12c;
  ulong uStack_128;
  ma_uint32 iChannel;
  ma_uint64 framesProcessedOut;
  ma_uint64 framesProcessedIn;
  ma_uint64 frameCountOut;
  ma_uint64 frameCountIn;
  float *pFramesOutF32;
  float *pFramesInF32;
  ma_uint64 *pFrameCountOut_local;
  void *pFramesOut_local;
  ma_uint64 *pFrameCountIn_local;
  void *pFramesIn_local;
  ma_linear_resampler *pResampler_local;
  ma_uint32 ilpf2;
  ma_uint32 ilpf1;
  float y;
  float x;
  float r1;
  float b;
  float a;
  ma_uint32 c;
  float y_1;
  float x_1;
  float r2;
  float r1_1;
  float a2;
  float a1;
  float b2;
  float b1;
  float b0;
  ma_uint32 c_1;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    __assert_fail("pResampler != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8062,
                  "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  if (pFrameCountIn == (ma_uint64 *)0x0) {
    __assert_fail("pFrameCountIn != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8063,
                  "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  if (pFrameCountOut == (ma_uint64 *)0x0) {
    __assert_fail("pFrameCountOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8064,
                  "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  frameCountOut = *pFrameCountIn;
  uVar8 = *pFrameCountOut;
  framesProcessedOut = 0;
  uStack_128 = 0;
  frameCountIn = (ma_uint64)pFramesOut;
  pFramesOutF32 = (float *)pFramesIn;
  while (uStack_128 < uVar8) {
    while (pResampler->inTimeInt != 0 && frameCountOut != 0) {
      if (pFramesOutF32 == (float *)0x0) {
        for (local_12c = 0; local_12c < (pResampler->config).channels; local_12c = local_12c + 1) {
          *(undefined4 *)((long)&pResampler->x0 + (ulong)local_12c * 4) =
               *(undefined4 *)((long)&pResampler->x1 + (ulong)local_12c * 4);
          *(undefined4 *)((long)&pResampler->x1 + (ulong)local_12c * 4) = 0;
        }
      }
      else {
        for (local_12c = 0; local_12c < (pResampler->config).channels; local_12c = local_12c + 1) {
          *(undefined4 *)((long)&pResampler->x0 + (ulong)local_12c * 4) =
               *(undefined4 *)((long)&pResampler->x1 + (ulong)local_12c * 4);
          *(float *)((long)&pResampler->x1 + (ulong)local_12c * 4) = pFramesOutF32[local_12c];
        }
        pFramesOutF32 = pFramesOutF32 + (pResampler->config).channels;
      }
      __dest = &pResampler->x1;
      if ((pResampler->lpf).format != ma_format_f32) {
        __assert_fail("pLPF->format == ma_format_f32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x799f,"void ma_lpf_process_pcm_frame_f32(ma_lpf *, float *, const void *)");
      }
      mVar7 = (pResampler->lpf).channels;
      mVar9 = ma_get_bytes_per_sample((pResampler->lpf).format);
      memcpy(__dest,&pResampler->x1,(ulong)(mVar9 * mVar7));
      for (pResampler_local._4_4_ = 0; pResampler_local._4_4_ < (pResampler->lpf).lpf1Count;
          pResampler_local._4_4_ = pResampler_local._4_4_ + 1) {
        uVar10 = (ulong)pResampler_local._4_4_;
        fVar1 = (pResampler->lpf).lpf1[uVar10].a.f32;
        for (b = 0.0; (uint)b < (pResampler->lpf).lpf1[uVar10].channels; b = (float)((int)b + 1)) {
          fVar11 = (1.0 - fVar1) * __dest->f32[(uint)b] +
                   fVar1 * (pResampler->lpf).lpf1[uVar10].r1[(uint)b].f32;
          __dest->f32[(uint)b] = fVar11;
          (pResampler->lpf).lpf1[uVar10].r1[(uint)b].f32 = fVar11;
        }
      }
      for (pResampler_local._0_4_ = 0; (uint)pResampler_local < (pResampler->lpf).lpf2Count;
          pResampler_local._0_4_ = (uint)pResampler_local + 1) {
        uVar10 = (ulong)(uint)pResampler_local;
        fVar1 = (pResampler->lpf).lpf2[uVar10].bq.b0.f32;
        fVar11 = (pResampler->lpf).lpf2[uVar10].bq.b1.f32;
        fVar2 = (pResampler->lpf).lpf2[uVar10].bq.b2.f32;
        fVar3 = (pResampler->lpf).lpf2[uVar10].bq.a1.f32;
        fVar4 = (pResampler->lpf).lpf2[uVar10].bq.a2.f32;
        for (b1 = 0.0; (uint)b1 < (pResampler->lpf).lpf2[uVar10].bq.channels;
            b1 = (float)((int)b1 + 1)) {
          fVar5 = (pResampler->lpf).lpf2[uVar10].bq.r2[(uint)b1].f32;
          fVar6 = __dest->f32[(uint)b1];
          fVar12 = fVar1 * fVar6 + (pResampler->lpf).lpf2[uVar10].bq.r1[(uint)b1].f32;
          __dest->f32[(uint)b1] = fVar12;
          (pResampler->lpf).lpf2[uVar10].bq.r1[(uint)b1].f32 =
               fVar11 * fVar6 + -(fVar3 * fVar12) + fVar5;
          (pResampler->lpf).lpf2[uVar10].bq.r2[(uint)b1].f32 = fVar2 * fVar6 + -(fVar4 * fVar12);
        }
      }
      frameCountOut = frameCountOut - 1;
      framesProcessedOut = framesProcessedOut + 1;
      pResampler->inTimeInt = pResampler->inTimeInt - 1;
    }
    if (pResampler->inTimeInt != 0) break;
    if (frameCountIn != 0) {
      if (pResampler->inTimeInt != 0) {
        __assert_fail("pResampler->inTimeInt == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x8091,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      ma_linear_resampler_interpolate_frame_f32(pResampler,(float *)frameCountIn);
      frameCountIn = frameCountIn + (ulong)(pResampler->config).channels * 4;
    }
    uStack_128 = uStack_128 + 1;
    pResampler->inTimeInt = pResampler->inAdvanceInt + pResampler->inTimeInt;
    pResampler->inTimeFrac = pResampler->inAdvanceFrac + pResampler->inTimeFrac;
    if ((pResampler->config).sampleRateOut <= pResampler->inTimeFrac) {
      pResampler->inTimeFrac = pResampler->inTimeFrac - (pResampler->config).sampleRateOut;
      pResampler->inTimeInt = pResampler->inTimeInt + 1;
    }
  }
  *pFrameCountIn = framesProcessedOut;
  *pFrameCountOut = uStack_128;
  return 0;
}

Assistant:

static ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    const float* pFramesInF32;
    /* */ float* pFramesOutF32;
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 framesProcessedIn;
    ma_uint64 framesProcessedOut;

    MA_ASSERT(pResampler     != NULL);
    MA_ASSERT(pFrameCountIn  != NULL);
    MA_ASSERT(pFrameCountOut != NULL);

    pFramesInF32       = (const float*)pFramesIn;
    pFramesOutF32      = (      float*)pFramesOut;
    frameCountIn       = *pFrameCountIn;
    frameCountOut      = *pFrameCountOut;
    framesProcessedIn  = 0;
    framesProcessedOut = 0;

    for (;;) {
        if (framesProcessedOut >= frameCountOut) {
            break;
        }

        /* Before interpolating we need to load the buffers. When doing this we need to ensure we run every input sample through the filter. */
        while (pResampler->inTimeInt > 0 && frameCountIn > 0) {
            ma_uint32 iChannel;

            if (pFramesInF32 != NULL) {
                for (iChannel = 0; iChannel < pResampler->config.channels; iChannel += 1) {
                    pResampler->x0.f32[iChannel] = pResampler->x1.f32[iChannel];
                    pResampler->x1.f32[iChannel] = pFramesInF32[iChannel];
                }
                pFramesInF32 += pResampler->config.channels;
            } else {
                for (iChannel = 0; iChannel < pResampler->config.channels; iChannel += 1) {
                    pResampler->x0.f32[iChannel] = pResampler->x1.f32[iChannel];
                    pResampler->x1.f32[iChannel] = 0;
                }
            }

            /* Filter. */
            ma_lpf_process_pcm_frame_f32(&pResampler->lpf, pResampler->x1.f32, pResampler->x1.f32);

            frameCountIn          -= 1;
            framesProcessedIn     += 1;
            pResampler->inTimeInt -= 1;
        }

        if (pResampler->inTimeInt > 0) {
            break;  /* Ran out of input data. */
        }

        /* Getting here means the frames have been loaded and filtered and we can generate the next output frame. */
        if (pFramesOutF32 != NULL) {
            MA_ASSERT(pResampler->inTimeInt == 0);
            ma_linear_resampler_interpolate_frame_f32(pResampler, pFramesOutF32);

            pFramesOutF32 += pResampler->config.channels;
        }

        framesProcessedOut += 1;

        /* Advance time forward. */
        pResampler->inTimeInt  += pResampler->inAdvanceInt;
        pResampler->inTimeFrac += pResampler->inAdvanceFrac;
        if (pResampler->inTimeFrac >= pResampler->config.sampleRateOut) {
            pResampler->inTimeFrac -= pResampler->config.sampleRateOut;
            pResampler->inTimeInt  += 1;
        }
    }

    *pFrameCountIn  = framesProcessedIn;
    *pFrameCountOut = framesProcessedOut;

    return MA_SUCCESS;
}